

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodeRawTransactionResponseStruct * __thiscall
cfd::api::json::DecodeRawTransactionResponse::ConvertToStruct(DecodeRawTransactionResponse *this)

{
  long in_RSI;
  DecodeRawTransactionResponseStruct *in_RDI;
  DecodeRawTransactionResponseStruct *result;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  *in_stack_000000b8;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
  *in_stack_000000c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *__x;
  DecodeRawTransactionResponseStruct *this_01;
  DecodeRawTransactionResponseStruct *in_stack_ffffffffffffffb0;
  vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> local_40;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  DecodeRawTransactionResponseStruct::DecodeRawTransactionResponseStruct(in_stack_ffffffffffffffb0);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->hash,(string *)(in_RSI + 0x58));
  in_RDI->version = *(uint32_t *)(in_RSI + 0x78);
  in_RDI->size = *(uint32_t *)(in_RSI + 0x7c);
  in_RDI->vsize = *(uint32_t *)(in_RSI + 0x80);
  in_RDI->weight = *(uint32_t *)(in_RSI + 0x84);
  in_RDI->locktime = *(uint32_t *)(in_RSI + 0x88);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
  ConvertToStruct(in_stack_000000c8);
  __x = &local_40;
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  operator=((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
             *)this_01,__x);
  std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
  ~vector((vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> *
          )this_01);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  ::ConvertToStruct(in_stack_000000b8);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffa8;
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  operator=((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
             *)this_01,
            (vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
             *)__x);
  std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  ~vector((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
           *)this_01);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,in_stack_ffffffffffffff78);
  return this_01;
}

Assistant:

DecodeRawTransactionResponseStruct DecodeRawTransactionResponse::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionResponseStruct result;
  result.txid = txid_;
  result.hash = hash_;
  result.version = version_;
  result.size = size_;
  result.vsize = vsize_;
  result.weight = weight_;
  result.locktime = locktime_;
  result.vin = vin_.ConvertToStruct();
  result.vout = vout_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}